

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Performance::anon_unknown_1::BufferInUseRenderTimeCase::init
          (BufferInUseRenderTimeCase *this,EVP_PKEY_CTX *ctx)

{
  ostringstream *this_00;
  UploadBufferTarget UVar1;
  MapFlags MVar2;
  int iVar3;
  char *pcVar4;
  int numBytes;
  int numBytes_00;
  char *pcVar5;
  char *pcVar6;
  string sStack_1e8;
  string local_1c8;
  MessageBuilder message;
  
  RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>::init
            (&this->
              super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>
             ,ctx);
  pcVar4 = "Draw method: drawElements";
  if ((this->
      super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>
      ).m_drawMethod == DRAWMETHOD_DRAW_ARRAYS) {
    pcVar4 = "Draw method: drawArrays";
  }
  UVar1 = this->m_uploadBufferTarget;
  pcVar5 = "mapBufferRange";
  if (this->m_uploadMethod == UPLOADMETHOD_BUFFER_SUB_DATA) {
    pcVar5 = "bufferSubData";
  }
  pcVar6 = "bufferData";
  if (this->m_uploadMethod != UPLOADMETHOD_BUFFER_DATA) {
    pcVar6 = pcVar5;
  }
  message.m_log =
       ((this->
        super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>
        ).super_RenderPerformanceTestBase.super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
       m_log;
  this_00 = &message.m_str;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
  std::operator<<(&this_00->super_basic_ostream<char,_std::char_traits<char>_>,
                  "Measuring the time used in ");
  std::operator<<(&this_00->super_basic_ostream<char,_std::char_traits<char>_>,pcVar4 + 0xd);
  std::operator<<(&this_00->super_basic_ostream<char,_std::char_traits<char>_>,
                  " call, a buffer upload, ");
  std::operator<<(&this_00->super_basic_ostream<char,_std::char_traits<char>_>,pcVar4 + 0xd);
  std::operator<<(&this_00->super_basic_ostream<char,_std::char_traits<char>_>,
                  " call using the uploaded buffer and readPixels call with different upload sizes.\n"
                 );
  if (UVar1 == UPLOADBUFFERTARGET_DIFFERENT_BUFFER) {
    std::operator<<(&this_00->super_basic_ostream<char,_std::char_traits<char>_>,"Rendering:\n");
    std::operator<<(&this_00->super_basic_ostream<char,_std::char_traits<char>_>,
                    "    before test: create and use buffers B and C\n");
    std::operator<<(&this_00->super_basic_ostream<char,_std::char_traits<char>_>,
                    "    first draw: render using buffer B\n");
    pcVar4 = (char *)0x0;
    if (this->m_uploadRange == UPLOADRANGE_PARTIAL) {
      pcVar4 = "    upload: modify buffer C contents\n";
    }
    pcVar5 = "    upload: respecify buffer C contents\n";
    if (this->m_uploadRange != UPLOADRANGE_FULL) {
      pcVar5 = pcVar4;
    }
    std::operator<<(&this_00->super_basic_ostream<char,_std::char_traits<char>_>,pcVar5);
    std::operator<<(&this_00->super_basic_ostream<char,_std::char_traits<char>_>,
                    "    second draw: render using buffer C\n");
    std::operator<<(&this_00->super_basic_ostream<char,_std::char_traits<char>_>,
                    "    read: readPixels\n");
  }
  else {
    std::operator<<(&this_00->super_basic_ostream<char,_std::char_traits<char>_>,"Rendering:\n");
    std::operator<<(&this_00->super_basic_ostream<char,_std::char_traits<char>_>,
                    "    before test: create and use buffer B\n");
    std::operator<<(&this_00->super_basic_ostream<char,_std::char_traits<char>_>,
                    "    first draw: render using buffer B\n");
    pcVar4 = (char *)0x0;
    if (this->m_uploadRange == UPLOADRANGE_PARTIAL) {
      pcVar4 = "    upload: modify buffer B contents\n";
    }
    pcVar5 = "    upload: respecify buffer B contents\n";
    if (this->m_uploadRange != UPLOADRANGE_FULL) {
      pcVar5 = pcVar4;
    }
    std::operator<<(&this_00->super_basic_ostream<char,_std::char_traits<char>_>,pcVar5);
    std::operator<<(&this_00->super_basic_ostream<char,_std::char_traits<char>_>,
                    "    second draw: render using buffer B\n");
    std::operator<<(&this_00->super_basic_ostream<char,_std::char_traits<char>_>,
                    "    read: readPixels\n");
  }
  std::operator<<(&this_00->super_basic_ostream<char,_std::char_traits<char>_>,"Uploading using ");
  std::operator<<(&this_00->super_basic_ostream<char,_std::char_traits<char>_>,pcVar6);
  MVar2 = this->m_mapFlags;
  if (MVar2 == MAPFLAG_INVALIDATE_BUFFER) {
    pcVar4 = ", flags = MAP_WRITE_BIT | MAP_INVALIDATE_BUFFER_BIT";
  }
  else if (MVar2 == MAPFLAG_INVALIDATE_RANGE) {
    pcVar4 = ", flags = MAP_WRITE_BIT | MAP_INVALIDATE_RANGE_BIT";
  }
  else {
    pcVar4 = (bool *)0x0;
    if (MVar2 == MAPFLAG_NONE) {
      pcVar4 = glcts::fixed_sample_locations_values + 1;
    }
  }
  std::operator<<(&this_00->super_basic_ostream<char,_std::char_traits<char>_>,pcVar4);
  std::operator<<(&this_00->super_basic_ostream<char,_std::char_traits<char>_>,"\n");
  std::ostream::operator<<
            (this_00,(int)(((long)(this->
                                  super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>
                                  ).m_results.
                                  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>::SampleResult,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>::SampleResult>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->
                                 super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>
                                 ).m_results.
                                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>::SampleResult,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>::SampleResult>_>
                                 ._M_impl.super__Vector_impl_data._M_start) / 0x58));
  std::operator<<(&this_00->super_basic_ostream<char,_std::char_traits<char>_>,
                  " test samples. Sample order is randomized.\n");
  std::operator<<(&this_00->super_basic_ostream<char,_std::char_traits<char>_>,
                  "All samples at even positions (first = 0) are tested before samples at odd positions.\n"
                 );
  std::operator<<(&this_00->super_basic_ostream<char,_std::char_traits<char>_>,
                  "Workload sizes are in the range [");
  iVar3 = RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>
          ::getMinWorkloadSize
                    (&this->
                      super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>
                    );
  std::ostream::operator<<(this_00,iVar3);
  std::operator<<(&this_00->super_basic_ostream<char,_std::char_traits<char>_>,",  ");
  iVar3 = RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>
          ::getMaxWorkloadSize
                    (&this->
                      super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>
                    );
  std::ostream::operator<<(this_00,iVar3);
  std::operator<<(&this_00->super_basic_ostream<char,_std::char_traits<char>_>,"] vertices ");
  std::operator<<(&this_00->super_basic_ostream<char,_std::char_traits<char>_>,"([");
  iVar3 = RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>
          ::getMinWorkloadSize
                    (&this->
                      super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>
                    );
  Performance::(anonymous_namespace)::getHumanReadableByteSize_abi_cxx11_
            (&local_1c8,(_anonymous_namespace_ *)(ulong)(uint)(iVar3 << 5),numBytes);
  std::operator<<(&this_00->super_basic_ostream<char,_std::char_traits<char>_>,(string *)&local_1c8)
  ;
  std::operator<<(&this_00->super_basic_ostream<char,_std::char_traits<char>_>,",");
  iVar3 = RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>
          ::getMaxWorkloadSize
                    (&this->
                      super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>
                    );
  Performance::(anonymous_namespace)::getHumanReadableByteSize_abi_cxx11_
            (&sStack_1e8,(_anonymous_namespace_ *)(ulong)(uint)(iVar3 << 5),numBytes_00);
  std::operator<<(&this_00->super_basic_ostream<char,_std::char_traits<char>_>,(string *)&sStack_1e8
                 );
  std::operator<<(&this_00->super_basic_ostream<char,_std::char_traits<char>_>,
                  "] to be processed).\n");
  std::operator<<(&this_00->super_basic_ostream<char,_std::char_traits<char>_>,
                  "Test result is the approximated processing rate in MiB / s of the second draw call and the readPixels call.\n"
                 );
  std::__cxx11::string::~string((string *)&sStack_1e8);
  std::__cxx11::string::~string((string *)&local_1c8);
  pcVar4 = 
  "Note! Test result may not be useful as is but instead should be compared against the buffer.render_after_upload.reference.draw_upload_draw group results.\n"
  ;
  if (UVar1 == UPLOADBUFFERTARGET_DIFFERENT_BUFFER) {
    pcVar4 = 
    "Note! Test result should only be used as a baseline reference result for buffer.render_after_upload.draw_modify_draw test group results."
    ;
  }
  std::operator<<(&this_00->super_basic_ostream<char,_std::char_traits<char>_>,pcVar4);
  tcu::MessageBuilder::operator<<(&message,(EndMessageToken *)&tcu::TestLog::EndMessage);
  iVar3 = std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
  return iVar3;
}

Assistant:

void BufferInUseRenderTimeCase::init (void)
{
	RenderCase<RenderUploadRenderReadDuration>::init();

	// log
	{
		const char* const	targetFunctionName		= (m_drawMethod == DRAWMETHOD_DRAW_ARRAYS) ? ("drawArrays") : ("drawElements");
		const char* const	uploadFunctionName		= (m_uploadMethod == UPLOADMETHOD_BUFFER_DATA) ? ("bufferData") : (m_uploadMethod == UPLOADMETHOD_BUFFER_SUB_DATA) ? ("bufferSubData") : ("mapBufferRange");
		const bool			isReferenceCase			= (m_uploadBufferTarget == UPLOADBUFFERTARGET_DIFFERENT_BUFFER);
		tcu::MessageBuilder	message					(&m_testCtx.getLog());

		message	<< "Measuring the time used in " << targetFunctionName << " call, a buffer upload, "
				<< targetFunctionName << " call using the uploaded buffer and readPixels call with different upload sizes.\n";

		if (isReferenceCase)
			message << "Rendering:\n"
					<< "    before test: create and use buffers B and C\n"
					<< "    first draw: render using buffer B\n"
					<< ((m_uploadRange == UPLOADRANGE_FULL)		? ("    upload: respecify buffer C contents\n")	:
						(m_uploadRange == UPLOADRANGE_PARTIAL)	? ("    upload: modify buffer C contents\n")	:
						((const char*)DE_NULL))
					<< "    second draw: render using buffer C\n"
					<< "    read: readPixels\n";
		else
			message << "Rendering:\n"
					<< "    before test: create and use buffer B\n"
					<< "    first draw: render using buffer B\n"
					<< ((m_uploadRange == UPLOADRANGE_FULL)		? ("    upload: respecify buffer B contents\n")	:
						(m_uploadRange == UPLOADRANGE_PARTIAL)	? ("    upload: modify buffer B contents\n")	:
						((const char*)DE_NULL))
					<< "    second draw: render using buffer B\n"
					<< "    read: readPixels\n";

		message	<< "Uploading using " << uploadFunctionName
					<< ((m_mapFlags == MAPFLAG_INVALIDATE_RANGE)	? (", flags = MAP_WRITE_BIT | MAP_INVALIDATE_RANGE_BIT")	:
						(m_mapFlags == MAPFLAG_INVALIDATE_BUFFER)	? (", flags = MAP_WRITE_BIT | MAP_INVALIDATE_BUFFER_BIT")	:
						(m_mapFlags == MAPFLAG_NONE)				? ("")														:
						((const char*)DE_NULL))
					<< "\n"
				<< getNumSamples() << " test samples. Sample order is randomized.\n"
				<< "All samples at even positions (first = 0) are tested before samples at odd positions.\n"
				<< "Workload sizes are in the range ["
					<< getMinWorkloadSize() << ",  "
					<< getMaxWorkloadSize() << "] vertices "
					<< "(["
					<< getHumanReadableByteSize(getMinWorkloadDataSize()) << ","
					<< getHumanReadableByteSize(getMaxWorkloadDataSize()) << "] to be processed).\n"
				<< "Test result is the approximated processing rate in MiB / s of the second draw call and the readPixels call.\n";

		if (isReferenceCase)
			message	<< "Note! Test result should only be used as a baseline reference result for buffer.render_after_upload.draw_modify_draw test group results.";
		else
			message	<< "Note! Test result may not be useful as is but instead should be compared against the buffer.render_after_upload.reference.draw_upload_draw group results.\n";

		message << tcu::TestLog::EndMessage;
	}
}